

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(char32_t c,ostream *os)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  void *in_RSI;
  uint in_EDI;
  
  poVar3 = (ostream *)std::ostream::operator<<(in_RSI,std::hex);
  poVar3 = std::operator<<(poVar3,"U+");
  uVar4 = std::ostream::operator<<(poVar3,std::uppercase);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,in_EDI);
  return;
}

Assistant:

void PrintTo(char32_t c, ::std::ostream* os) {
  *os << std::hex << "U+" << std::uppercase << std::setfill('0') << std::setw(4)
      << static_cast<uint32_t>(c);
}